

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkCommsInterface.cpp
# Opt level: O0

int __thiscall
helics::NetworkCommsInterface::findOpenPort(NetworkCommsInterface *this,int count,string_view host)

{
  int iVar1;
  __int_type_conflict _Var2;
  int in_ESI;
  long *in_RDI;
  int in_stack_00000034;
  PortAllocator *in_stack_00000038;
  string_view in_stack_00000040;
  int start;
  int dport;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  __atomic_base<int> *in_stack_ffffffffffffff68;
  int local_80;
  allocator<char> *in_stack_ffffffffffffff90;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  
  iVar1 = PortAllocator::getDefaultStartingPort((PortAllocator *)(in_RDI + 0x85));
  if (iVar1 < 0) {
    _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff68);
    iVar1 = (**(code **)(*in_RDI + 0x50))();
    iVar1 = _Var2 - iVar1;
    if ((SBORROW4(iVar1,in_ESI * 10) == iVar1 + in_ESI * -10 < 0) || (iVar1 < 0)) {
      _Var2 = std::__atomic_base::operator_cast_to_int(in_stack_ffffffffffffff68);
      local_80 = _Var2 + in_ESI * 5;
    }
    else {
      local_80 = (**(code **)(*in_RDI + 0x50))();
      local_80 = local_80 + in_ESI * 10 * (iVar1 + 1);
    }
    PortAllocator::setStartingPortNumber((PortAllocator *)(in_RDI + 0x85),local_80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  iVar1 = PortAllocator::findOpenPort(in_stack_00000038,in_stack_00000034,in_stack_00000040);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff60));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  return iVar1;
}

Assistant:

int NetworkCommsInterface::findOpenPort(int count, std::string_view host)
{
    if (openPorts.getDefaultStartingPort() < 0) {
        auto dport = PortNumber - getDefaultBrokerPort();
        auto start = (dport < 10 * count && dport >= 0) ?
            getDefaultBrokerPort() + 10 * count * (dport + 1) :
            PortNumber + 5 * count;
        openPorts.setStartingPortNumber(start);
    }
    return openPorts.findOpenPort(count, std::string(host));
}